

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::RenderDeviceGLImpl::CreateFramebuffer
          (RenderDeviceGLImpl *this,FramebufferDesc *Desc,IFramebuffer **ppFramebuffer)

{
  anon_class_32_4_88180df4 ConstructObject;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pDeviceContext;
  string msg;
  undefined1 local_58 [16];
  FramebufferDesc *pFStack_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  RefCntAutoPtr<Diligent::RenderDeviceGLImpl> local_30;
  RefCntAutoPtr<Diligent::BufferGLImpl> local_28;
  
  if ((this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_58._0_8_ = (DeviceContextGLImpl *)0x0;
  }
  else {
    RefCntWeakPtr<Diligent::DeviceContextGLImpl>::Lock
              ((RefCntWeakPtr<Diligent::DeviceContextGLImpl> *)local_58);
    if ((DeviceContextGLImpl *)local_58._0_8_ != (DeviceContextGLImpl *)0x0) goto LAB_002e63b3;
  }
  FormatString<char[44]>
            ((string *)(local_58 + 8),(char (*) [44])"Immediate device context has been destroyed");
  DebugAssertionFailed
            ((Char *)local_58._8_8_,"CreateFramebuffer",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
             ,0x250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._8_8_ != &local_40) {
    operator_delete((void *)local_58._8_8_,local_40._M_allocated_capacity + 1);
  }
LAB_002e63b3:
  local_30.m_pObject = (RenderDeviceGLImpl *)(local_58._0_8_ + 0x750);
  local_40._M_allocated_capacity = (size_type)&local_30;
  local_40._8_8_ = &local_28;
  ConstructObject.Desc = Desc;
  ConstructObject.this = &this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>;
  ConstructObject.ExtraArgs =
       (reference_wrapper<Diligent::GLContextState> *)local_40._M_allocated_capacity;
  ConstructObject.ppFramebuffer = (IFramebuffer ***)local_40._8_8_;
  local_58._8_8_ = this;
  pFStack_48 = Desc;
  local_28.m_pObject = (BufferGLImpl *)ppFramebuffer;
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateDeviceObject<Diligent::IFramebuffer,Diligent::FramebufferDesc,Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::CreateFramebufferImpl<std::reference_wrapper<Diligent::GLContextState>>(Diligent::IFramebuffer**,Diligent::FramebufferDesc_const&,std::reference_wrapper<Diligent::GLContextState>const&)::_lambda()_1_>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,"Framebuffer",Desc,
             ppFramebuffer,ConstructObject);
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)local_58);
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateFramebuffer(const FramebufferDesc& Desc, IFramebuffer** ppFramebuffer)
{
    auto pDeviceContext = GetImmediateContext(0);
    VERIFY(pDeviceContext, "Immediate device context has been destroyed");
    auto& GLState = pDeviceContext->GetContextState();

    CreateFramebufferImpl(ppFramebuffer, Desc, std::ref(GLState));
}